

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<int>::FindNode(BpTree<int> *this,Addr p,IndexNode<int> *Node)

{
  int iVar1;
  ostream *this_00;
  string local_78 [48];
  string local_48 [36];
  int local_24;
  IndexNode<int> *pIStack_20;
  int BlockNum;
  IndexNode<int> *Node_local;
  BpTree<int> *this_local;
  Addr p_local;
  
  this_local._4_4_ = p.FileOff;
  pIStack_20 = Node;
  Node_local = (IndexNode<int> *)this;
  this_local = (BpTree<int> *)p;
  if (this_local._4_4_ == -1) {
    this_00 = std::operator<<((ostream *)&std::cout,"Wrong address!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    system("pause");
    exit(1);
  }
  std::__cxx11::string::string(local_48,(string *)&this->Index_FileName);
  iVar1 = Buffer::Find(&blocks,(string *)local_48,this_local._4_4_);
  std::__cxx11::string::~string(local_48);
  local_24 = iVar1;
  if (iVar1 == -1) {
    std::__cxx11::string::string(local_78,(string *)&this->Index_FileName);
    local_24 = Buffer::Allocate(&blocks,(string *)local_78,this_local._4_4_);
    std::__cxx11::string::~string(local_78);
  }
  (pIStack_20->self).BlockNum = local_24;
  (pIStack_20->self).FileOff = this_local._4_4_;
  Block2Node(this,local_24,pIStack_20);
  return;
}

Assistant:

void BpTree<K>::FindNode(Addr p, IndexNode<K>& Node) {
	if (p.FileOff == -1) {
		cout << "Wrong address!" << endl;
		system("pause");
		exit(1);
	}
	int BlockNum = blocks.Find(this->Index_FileName, p.FileOff);		//���Ҹÿ��Ƿ�����buffer����
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, p.FileOff);	//���û�У�������һ��
	}
	Node.self.BlockNum = BlockNum;										//��ַp�еĿ�Ų�����
	Node.self.FileOff = p.FileOff;
	this->Block2Node(BlockNum, Node);									//��������Ϣ���ർ���㵱��
}